

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

uint64_t roaring64_bitmap_get_cardinality(roaring64_bitmap_t *r)

{
  int iVar1;
  uint64_t uVar2;
  art_iterator_t it;
  
  art_init_iterator(&it,&r->art,true);
  uVar2 = 0;
  while (it.value != (art_val_t *)0x0) {
    iVar1 = container_get_cardinality(*(container_t **)(it.value[1].key + 2),it.value[1].key[0]);
    uVar2 = uVar2 + (long)iVar1;
    art_iterator_next(&it);
  }
  return uVar2;
}

Assistant:

uint64_t roaring64_bitmap_get_cardinality(const roaring64_bitmap_t *r) {
    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    uint64_t cardinality = 0;
    while (it.value != NULL) {
        leaf_t *leaf = (leaf_t *)it.value;
        cardinality +=
            container_get_cardinality(leaf->container, leaf->typecode);
        art_iterator_next(&it);
    }
    return cardinality;
}